

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

void __thiscall
duckdb::ReservoirSample::ShuffleSel
          (ReservoirSample *this,SelectionVector *sel,idx_t range,idx_t size)

{
  sel_t *psVar1;
  uint uVar2;
  reference pvVar3;
  idx_t iVar4;
  sel_t sVar5;
  size_type __n;
  SelectionVector original_sel;
  vector<unsigned_int,_true> randomized;
  SelectionVector local_50;
  vector<unsigned_int,_true> local_38;
  
  GetRandomizedVector(&local_38,this,(uint32_t)range,(uint32_t)size);
  SelectionVector::SelectionVector(&local_50,range);
  if (range != 0) {
    psVar1 = sel->sel_vector;
    iVar4 = 0;
    do {
      sVar5 = (sel_t)iVar4;
      if (psVar1 != (sel_t *)0x0) {
        sVar5 = psVar1[iVar4];
      }
      local_50.sel_vector[iVar4] = sVar5;
      iVar4 = iVar4 + 1;
    } while (range != iVar4);
  }
  if (size != 0) {
    __n = 0;
    do {
      pvVar3 = vector<unsigned_int,_true>::operator[](&local_38,__n);
      uVar2 = *pvVar3;
      if (local_50.sel_vector != (sel_t *)0x0) {
        uVar2 = local_50.sel_vector[uVar2];
      }
      sel->sel_vector[__n] = uVar2;
      __n = __n + 1;
    } while (size != __n);
  }
  if (local_50.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReservoirSample::ShuffleSel(SelectionVector &sel, idx_t range, idx_t size) const {
	auto randomized = GetRandomizedVector(static_cast<uint32_t>(range), static_cast<uint32_t>(size));
	SelectionVector original_sel(range);
	for (idx_t i = 0; i < range; i++) {
		original_sel.set_index(i, sel.get_index(i));
	}
	for (idx_t i = 0; i < size; i++) {
		sel.set_index(i, original_sel.get_index(randomized[i]));
	}
}